

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str_hash.c
# Opt level: O2

void str_hash_init_sse42(void)

{
  __pid_t _Var1;
  time_t tVar2;
  long lVar3;
  undefined4 uVar4;
  uint uVar5;
  long lVar6;
  
  hash_sparse = hash_sparse_sse42;
  hash_dense = hash_dense_sse42;
  _Var1 = getpid();
  lVar6 = 0;
  uVar4 = crc32(0,_Var1);
  tVar2 = time((time_t *)0x0);
  uVar5 = crc32(uVar4,(int)tVar2);
  srandom(uVar5);
  for (; lVar6 != 3; lVar6 = lVar6 + 1) {
    random_pos[lVar6] = (uint32_t  [2])0x0;
  }
  for (lVar6 = 3; lVar6 != 0x1f; lVar6 = lVar6 + 1) {
    lVar3 = random();
    uVar5 = ~(uint)(-2L << ((byte)lVar6 & 0x3f));
    random_pos[lVar6][0] = (uint)lVar3 & uVar5;
    lVar3 = random();
    random_pos[lVar6][1] = (uint)lVar3 & uVar5;
  }
  return;
}

Assistant:

void str_hash_init_sse42(void)
{
  hash_sparse = hash_sparse_sse42;
#if LUAJIT_SECURITY_STRHASH
  hash_dense = hash_dense_sse42;
#endif
  str_hash_init_random();
}